

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.c
# Opt level: O2

int main(int argc,char **argv)

{
  Uint8 UVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  SDL_Cursor *pSVar6;
  SDL_Cursor *pSVar7;
  SDL_Cursor *pSVar8;
  undefined8 uVar9;
  long lVar10;
  FILE *pFVar11;
  long lVar12;
  char *__format;
  ulong uVar13;
  Uint8 UVar14;
  Uint8 UVar15;
  long lVar16;
  undefined4 local_160;
  int hot_x;
  SDL_Cursor *cursor [3];
  Uint8 data [128];
  Uint8 mask [128];
  
  iVar4 = SDL_Init(0x20);
  pFVar11 = _stderr;
  if (iVar4 < 0) {
    uVar9 = SDL_GetError();
    __format = "Couldn\'t initialize SDL: %s\n";
LAB_001014a5:
    fprintf(pFVar11,__format,uVar9);
    return 1;
  }
  lVar5 = SDL_SetVideoMode(0x140,200,8,0x10000000);
  pFVar11 = _stderr;
  if (lVar5 == 0) {
    uVar9 = SDL_GetError();
    __format = "Couldn\'t initialize video mode: %s\n";
    goto LAB_001014a5;
  }
  SDL_FillRect(lVar5,0,0x664422);
  pSVar6 = (SDL_Cursor *)SDL_CreateCursor(cursor_data,cursor_mask,0x10,0x10,8,8);
  cursor[0] = pSVar6;
  if (pSVar6 != (SDL_Cursor *)0x0) {
    lVar10 = -1;
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      iVar4 = *(int *)(arrow_rel + lVar12 * 4 + 0x10);
      for (uVar13 = 0; uVar13 != 0x20; uVar13 = uVar13 + 1) {
        lVar16 = (long)(int)lVar10;
        if ((uVar13 & 7) == 0) {
          lVar10 = lVar16 + 1;
          mask[lVar16 + 1] = '\0';
          data[lVar16 + 1] = '\0';
          UVar15 = '\x01';
          UVar14 = '\x01';
        }
        else {
          UVar14 = data[lVar16];
          data[lVar16] = UVar14 * '\x02';
          UVar1 = mask[lVar16];
          mask[lVar16] = UVar1 * '\x02';
          UVar15 = UVar14 * '\x02' + '\x01';
          UVar14 = UVar1 * '\x02' + '\x01';
        }
        if (arrow_rel[(long)iVar4 + uVar13] == '.') {
LAB_00101308:
          mask[(int)lVar10] = UVar14;
        }
        else if (arrow_rel[(long)iVar4 + uVar13] == 'X') {
          data[(int)lVar10] = UVar15;
          goto LAB_00101308;
        }
      }
    }
    __isoc99_sscanf("0,0","%d,%d",&hot_x,&local_160);
    pSVar7 = (SDL_Cursor *)SDL_CreateCursor(data,mask,0x20,0x20,hot_x,local_160);
    pFVar11 = _stderr;
    cursor[1] = pSVar7;
    if (pSVar7 == (SDL_Cursor *)0x0) {
      uVar9 = SDL_GetError();
      fprintf(pFVar11,"Couldn\'t initialize arrow cursor: %s\n",uVar9);
      SDL_FreeCursor(pSVar6);
      goto LAB_001014df;
    }
    pSVar8 = (SDL_Cursor *)SDL_CreateCursor(small_cursor_data,small_cursor_mask,8,0xb,3,5);
    cursor[2] = pSVar8;
    if (pSVar8 != (SDL_Cursor *)0x0) {
      SDL_SetCursor(pSVar6);
      bVar2 = false;
      uVar13 = 0;
      while (!bVar2) {
        bVar3 = false;
        while( true ) {
          bVar2 = bVar3;
          iVar4 = SDL_PollEvent(data);
          if (iVar4 == 0) break;
          if (data[0] == '\x02') {
            bVar3 = bVar2;
            if (data._8_4_ == 0x1b) {
              bVar3 = true;
            }
          }
          else {
            bVar3 = true;
            if ((data[0] != '\f') && (bVar3 = bVar2, data[0] == '\x05')) {
              uVar13 = (ulong)((int)uVar13 + 1) % 3;
              SDL_SetCursor(cursor[uVar13]);
            }
          }
        }
        SDL_Flip(lVar5);
        SDL_Delay(1);
      }
      SDL_FreeCursor(pSVar6);
      SDL_FreeCursor(pSVar7);
      SDL_FreeCursor(pSVar8);
      SDL_Quit();
      return 0;
    }
  }
  pFVar11 = _stderr;
  uVar9 = SDL_GetError();
  fprintf(pFVar11,"Couldn\'t initialize test cursor: %s\n",uVar9);
LAB_001014df:
  SDL_Quit();
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_bool quit = SDL_FALSE;
	SDL_Cursor *cursor[3];
	int current;

	/* Load the SDL library */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	screen = SDL_SetVideoMode(320,200,8,SDL_ANYFORMAT);
	if (screen==NULL) {
		fprintf(stderr, "Couldn't initialize video mode: %s\n",SDL_GetError());
		return(1);
	}

	SDL_FillRect(screen, NULL, 0x664422);

	cursor[0] = SDL_CreateCursor((Uint8 *)cursor_data, (Uint8 *)cursor_mask,
		16, 16, 8, 8);
	if (cursor[0]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}
	cursor[1] = create_arrow_cursor();
	if (cursor[1]==NULL) {
		fprintf(stderr, "Couldn't initialize arrow cursor: %s\n",SDL_GetError());
		SDL_FreeCursor(cursor[0]);
		SDL_Quit();
		return(1);
	}
	cursor[2] = SDL_CreateCursor(small_cursor_data, small_cursor_mask,
		8, 11, 3, 5);
	if (cursor[2]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}

	current = 0;
	SDL_SetCursor(cursor[current]);

	while (!quit) {
		SDL_Event	event;
		while (SDL_PollEvent(&event)) {
			switch(event.type) {
				case SDL_MOUSEBUTTONDOWN:
					current = (current + 1)%3;
					SDL_SetCursor(cursor[current]);
					break;
				case SDL_KEYDOWN:
					if (event.key.keysym.sym == SDLK_ESCAPE) {
						quit = SDL_TRUE;
					}
					break;
				case SDL_QUIT:
					quit = SDL_TRUE;
					break;
			}
		}	
		SDL_Flip(screen);
		SDL_Delay(1);
	}

	SDL_FreeCursor(cursor[0]);
	SDL_FreeCursor(cursor[1]);
	SDL_FreeCursor(cursor[2]);

	SDL_Quit();
	return(0);
}